

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O3

void __thiscall
cereal::InputArchive<cereal::JSONInputArchive,_0U>::InputArchive
          (InputArchive<cereal::JSONInputArchive,_0U> *this,JSONInputArchive *derived)

{
  (this->super_InputArchiveBase)._vptr_InputArchiveBase = (_func_int **)&PTR__InputArchive_001d5230;
  (this->itsDeferments).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->itsDeferments).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->itsDeferments).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->self = derived;
  *(undefined8 *)&(this->itsBaseClassSet)._M_h._M_rehash_policy = 0;
  (this->itsBaseClassSet)._M_h._M_buckets = &(this->itsBaseClassSet)._M_h._M_single_bucket;
  (this->itsBaseClassSet)._M_h._M_bucket_count = 1;
  (this->itsBaseClassSet)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->itsBaseClassSet)._M_h._M_element_count = 0;
  (this->itsBaseClassSet)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->itsSharedPointerMap)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->itsSharedPointerMap)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->itsSharedPointerMap)._M_h._M_rehash_policy = 0;
  (this->itsBaseClassSet)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->itsBaseClassSet)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->itsSharedPointerMap)._M_h._M_buckets = &(this->itsSharedPointerMap)._M_h._M_single_bucket;
  (this->itsSharedPointerMap)._M_h._M_bucket_count = 1;
  (this->itsSharedPointerMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->itsSharedPointerMap)._M_h._M_element_count = 0;
  (this->itsSharedPointerMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->itsSharedPointerMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->itsSharedPointerMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->itsPolymorphicTypeMap)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->itsPolymorphicTypeMap)._M_h._M_bucket_count = 0;
  (this->itsPolymorphicTypeMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->itsPolymorphicTypeMap)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->itsPolymorphicTypeMap)._M_h._M_rehash_policy = 0;
  (this->itsPolymorphicTypeMap)._M_h._M_buckets =
       &(this->itsPolymorphicTypeMap)._M_h._M_single_bucket;
  (this->itsPolymorphicTypeMap)._M_h._M_bucket_count = 1;
  (this->itsPolymorphicTypeMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->itsPolymorphicTypeMap)._M_h._M_element_count = 0;
  (this->itsPolymorphicTypeMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->itsVersionedTypes)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->itsVersionedTypes)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->itsVersionedTypes)._M_h._M_rehash_policy = 0;
  (this->itsPolymorphicTypeMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->itsPolymorphicTypeMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->itsVersionedTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->itsVersionedTypes)._M_h._M_element_count = 0;
  (this->itsVersionedTypes)._M_h._M_buckets = &(this->itsVersionedTypes)._M_h._M_single_bucket;
  (this->itsVersionedTypes)._M_h._M_bucket_count = 1;
  (this->itsVersionedTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->itsVersionedTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->itsVersionedTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

InputArchive(ArchiveType * const derived) :
        self(derived),
        itsBaseClassSet(),
        itsSharedPointerMap(),
        itsPolymorphicTypeMap(),
        itsVersionedTypes()
      { }